

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall
QMenuPrivate::popup(QMenuPrivate *this,QPoint *p,QAction *atAction,PositionFunction positionFunction
                   )

{
  quint8 *pqVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  ushort uVar30;
  QWidget *this_00;
  Data *pDVar31;
  QMenuScroller *pQVar32;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var33;
  QRect *pQVar34;
  qreal qVar35;
  Representation RVar36;
  Representation RVar37;
  Representation RVar38;
  Representation RVar39;
  bool bVar40;
  char cVar41;
  ushort uVar42;
  Representation RVar43;
  int iVar44;
  int iVar45;
  LayoutDirection LVar46;
  Representation RVar47;
  int iVar48;
  QObject *pQVar49;
  Data *pDVar50;
  long lVar51;
  QWindow *pQVar52;
  QGraphicsProxyWidget *pQVar53;
  QScreen *pQVar54;
  ulong uVar55;
  QStyle *pQVar56;
  QWidget *pQVar57;
  QPoint QVar58;
  byte bVar59;
  long in_RCX;
  ulong uVar60;
  QRect *pQVar61;
  undefined4 uVar62;
  int iVar63;
  Representation RVar64;
  QRect *pQVar65;
  ulong uVar66;
  ulong uVar67;
  uint uVar68;
  int iVar70;
  int *piVar71;
  uint uVar72;
  QWidget *this_01;
  long in_FS_OFFSET;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  QRect QVar81;
  QPoint mouse;
  QSize menuSizeHint;
  undefined8 local_80;
  undefined8 local_78;
  QPoint local_70;
  QRect local_68;
  QRect local_58;
  QWidget *pQStack_48;
  undefined8 local_40;
  long local_38;
  ulong uVar69;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar49 = (QObject *)QGuiApplication::screenAt(p);
  if (pQVar49 == (QObject *)0x0) {
    pDVar50 = (Data *)0x0;
  }
  else {
    pDVar50 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar49);
  }
  pDVar31 = (this->popupScreen).wp.d;
  (this->popupScreen).wp.d = pDVar50;
  (this->popupScreen).wp.value = pQVar49;
  if (pDVar31 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar31 = *(int *)pDVar31 + -1;
    UNLOCK();
    if (*(int *)pDVar31 == 0) {
      operator_delete(pDVar31);
    }
  }
  pQVar32 = this->scroll;
  if (pQVar32 != (QMenuScroller *)0x0) {
    if (pQVar32->scrollOffset != 0) {
      this->field_0x420 = this->field_0x420 | 1;
    }
    pQVar32->scrollOffset = 0;
    pQVar32->scrollFlags = '\0';
  }
  this->motions = 0;
  *(ushort *)&this->field_0x420 = (ushort)*(undefined4 *)&this->field_0x420 & 0xe7ff | 0x1000;
  updateLayoutDirection(this);
  QWidget::ensurePolished(this_00);
  if (this->eventLoop == (QEventLoop *)0x0) {
    QWidgetPrivate::createTLExtra(&this->super_QWidgetPrivate);
    _Var33.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         (((this->super_QWidgetPrivate).extra._M_t.
           super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
         super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    lVar51 = *(long *)((long)_Var33.
                             super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                             super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                             super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8);
    if (((lVar51 == 0) || (*(int *)(lVar51 + 4) == 0)) ||
       (pQVar54 = *(QScreen **)
                   ((long)_Var33.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                          _M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                          super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0),
       pQVar54 == (QScreen *)0x0)) {
      pQVar57 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (pQVar57 != (QWidget *)0x0) {
        pQVar54 = QWidget::screen(pQVar57);
        goto LAB_0045aa6e;
      }
      bVar40 = QWidgetPrivate::setScreenForPoint(&this->super_QWidgetPrivate,p);
    }
    else {
LAB_0045aa6e:
      bVar40 = QWidgetPrivate::setScreen(&this->super_QWidgetPrivate,pQVar54);
    }
    if (bVar40 != false) {
      this->field_0x420 = this->field_0x420 | 1;
    }
  }
  topCausedWidget(this);
  lVar51 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
  if (((*(ushort *)&this->field_0x420 & 4) == 0) == (lVar51 == 0)) {
    *(ushort *)&this->field_0x420 =
         (*(ushort *)&this->field_0x420 & 0xfffa) + (ushort)(lVar51 == 0) * 4 + 1;
  }
  pQVar52 = QWidgetPrivate::windowHandle(&this->super_QWidgetPrivate,Direct);
  if (pQVar52 == (QWindow *)0x0) {
    QWidgetPrivate::createWinId(&this->super_QWidgetPrivate);
  }
  topCausedWidget(this);
  lVar51 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
  QWidget::setAttribute(this_00,WA_X11NetWmWindowTypeDropDownMenu,lVar51 != 0);
  QMetaObject::activate(&this_00->super_QObject,&QMenu::staticMetaObject,0,(void **)0x0);
  bVar59 = this->field_0x420;
  for (pQVar57 = this_00; pQVar57 != (QWidget *)0x0;
      pQVar57 = *(QWidget **)(*(long *)&pQVar57->field_0x8 + 0x10)) {
    if (((pQVar57->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 0x20000000) != 0) goto LAB_0045ab64;
  }
  pQVar53 = QWidgetPrivate::nearestGraphicsProxyWidget(this_00);
  if (pQVar53 == (QGraphicsProxyWidget *)0x0) {
LAB_0045ab64:
    pQVar54 = (QScreen *)QGuiApplication::screenAt(p);
  }
  else {
    pQVar54 = (QScreen *)0x0;
  }
  local_68 = popupGeometry(this,pQVar54);
  updateActionRects(this,&local_68);
  local_70.xp.m_i = 0;
  local_70.yp.m_i = 0;
  lVar51 = QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
  if ((~bVar59 & 1) == 0 && lVar51 != 0) {
    local_70 = QPushButtonPrivate::adjustedMenuPosition(*(QPushButtonPrivate **)(lVar51 + 8));
  }
  else {
    local_70 = *p;
  }
  pQVar49 = (QObject *)QGuiApplication::screenAt(&local_70);
  if (pQVar49 == (QObject *)0x0) {
    pDVar50 = (Data *)0x0;
  }
  else {
    pDVar50 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar49);
  }
  pDVar31 = (this->popupScreen).wp.d;
  (this->popupScreen).wp.d = pDVar50;
  (this->popupScreen).wp.value = pQVar49;
  if (pDVar31 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar31 = *(int *)pDVar31 + -1;
    UNLOCK();
    if (*(int *)pDVar31 == 0) {
      operator_delete(pDVar31);
    }
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  uVar55 = (**(code **)(*(long *)this_00 + 0x70))(this_00);
  uVar66 = uVar55 >> 0x20;
  local_78 = (undefined1 *)uVar55;
  if (*(long *)(in_RCX + 0x10) != 0) {
    local_70 = (QPoint)(**(code **)(in_RCX + 0x18))();
  }
  pQVar56 = QWidget::style(this_00);
  RVar43.m_i = (**(code **)(*(long *)pQVar56 + 0xe0))(pQVar56,0x20,0,this_00);
  pQVar57 = QWidget::window(this_00);
  bVar40 = QWidget::testAttribute_helper(pQVar57,WA_DontShowOnScreen);
  RVar39.m_i = local_68.y2.m_i;
  RVar36.m_i = local_68.x1.m_i;
  RVar37.m_i = local_68.y1.m_i;
  iVar44 = local_68.y2.m_i + 1;
  iVar45 = iVar44 - local_68.y1.m_i;
  RVar38.m_i = local_68.x2.m_i;
  uVar68 = local_68.x2.m_i + 1;
  uVar69 = (ulong)uVar68;
  iVar70 = uVar68 - local_68.x1.m_i;
  iVar80 = (int)(uVar55 >> 0x20);
  if ((iVar45 < iVar80) || (iVar70 < (int)uVar55)) {
LAB_0045acf7:
    uVar72 = uVar68 - (local_68.x1.m_i + RVar43.m_i * 2);
    if ((int)(uint)local_78 < (int)uVar72) {
      uVar72 = (uint)local_78;
    }
    uVar55 = (ulong)uVar72;
    uVar72 = iVar45 + RVar43.m_i * -2;
    if ((int)local_78._4_4_ < (int)uVar72) {
      uVar72 = local_78._4_4_;
    }
    bVar59 = this->ncols;
    bVar40 = true;
    uVar66 = (ulong)uVar72;
  }
  else {
    bVar40 = !bVar40;
    bVar59 = this->ncols;
    if ((1 < bVar59) && (iVar80 < iVar45)) goto LAB_0045acf7;
  }
  if (bVar59 < 2) {
    if ((atAction != (QAction *)0x0) &&
       (uVar67 = (this->super_QWidgetPrivate).actions.d.size, uVar67 != 0)) {
      pQVar34 = (this->actionRects).d.ptr;
      uVar60 = 0;
      lVar51 = 0xc;
      iVar45 = 0;
      do {
        if ((this->super_QWidgetPrivate).actions.d.ptr[uVar60] == atAction) {
          local_70.yp.m_i = local_70.yp.m_i - iVar45;
          pQVar32 = this->scroll;
          if ((pQVar32 == (QMenuScroller *)0x0) || (RVar43.m_i <= local_70.yp.m_i)) {
            if ((pQVar32 == (QMenuScroller *)0x0) || (pQVar32->scrollFlags == '\0')) break;
          }
          else {
            pQVar32->scrollFlags = pQVar32->scrollFlags | 1;
            pQVar32->scrollOffset = local_70.yp.m_i;
            local_70.yp.m_i = RVar43.m_i;
          }
          pQVar56 = QWidget::style(this_00);
          uVar69 = 0;
          iVar80 = (**(code **)(*(long *)pQVar56 + 0xf0))(pQVar56,0x2d,0,this_00);
          if (iVar80 == 0) {
            uVar67 = (this->actionRects).d.size;
            uVar72 = iVar45 + this->scroll->scrollOffset;
            if ((uVar60 & 0xffffffff) < uVar67) {
              piVar71 = (int *)((long)&(((this->actionRects).d.ptr)->x1).m_i + lVar51);
              uVar66 = (ulong)uVar72;
              do {
                uVar66 = (ulong)((((int)uVar66 + *piVar71) - piVar71[-2]) + 1);
                uVar60 = uVar60 + 1;
                piVar71 = piVar71 + 4;
              } while (uVar60 < uVar67);
            }
            else {
              uVar66 = (ulong)uVar72;
            }
          }
          break;
        }
        iVar45 = ((iVar45 + *(int *)((long)&(pQVar34->x1).m_i + lVar51)) -
                 *(int *)((long)pQVar34 + lVar51 + -8)) + 1;
        uVar60 = uVar60 + 1;
        lVar51 = lVar51 + 0x10;
      } while (uVar60 < uVar67);
    }
  }
  else {
    local_70.yp.m_i = local_68.y1.m_i + RVar43.m_i;
  }
  QVar81 = QWidget::childrenRect(this_00);
  if ((QVar81.x2.m_i.m_i < QVar81.x1.m_i.m_i) || (QVar81.y2.m_i.m_i < QVar81.y1.m_i.m_i)) {
    pQVar61 = (this->actionRects).d.ptr;
    uVar67 = (this->actionRects).d.size;
    uVar60 = uVar67 * 0x10;
    pQVar34 = pQVar61 + uVar67;
    pQVar65 = pQVar61;
    if (0 < (long)uVar67 >> 2) {
      lVar51 = ((long)uVar67 >> 2) + 1;
      pQVar65 = pQVar61 + 2;
      do {
        uVar2 = pQVar65[-2].x1;
        uVar16 = pQVar65[-2].y1;
        uVar3 = pQVar65[-2].x2;
        uVar17 = pQVar65[-2].y2;
        iVar45 = -(uint)(uVar3 == uVar2 + -1);
        iVar80 = -(uint)(uVar17 == uVar16 + -1);
        auVar76._4_4_ = iVar45;
        auVar76._0_4_ = iVar45;
        auVar76._8_4_ = iVar80;
        auVar76._12_4_ = iVar80;
        iVar45 = movmskpd((int)uVar69,auVar76);
        if (iVar45 != 3) {
          pQVar65 = pQVar65 + -2;
          goto LAB_0045b00b;
        }
        uVar4 = pQVar65[-1].x1;
        uVar18 = pQVar65[-1].y1;
        uVar5 = pQVar65[-1].x2;
        uVar19 = pQVar65[-1].y2;
        iVar45 = -(uint)(uVar5 == uVar4 + -1);
        iVar80 = -(uint)(uVar19 == uVar18 + -1);
        auVar77._4_4_ = iVar45;
        auVar77._0_4_ = iVar45;
        auVar77._8_4_ = iVar80;
        auVar77._12_4_ = iVar80;
        iVar45 = movmskpd(0,auVar77);
        if (iVar45 != 3) {
          pQVar65 = pQVar65 + -1;
          goto LAB_0045b00b;
        }
        uVar6 = pQVar65->x1;
        uVar20 = pQVar65->y1;
        uVar7 = pQVar65->x2;
        uVar21 = pQVar65->y2;
        iVar45 = -(uint)(uVar7 == uVar6 + -1);
        iVar80 = -(uint)(uVar21 == uVar20 + -1);
        auVar78._4_4_ = iVar45;
        auVar78._0_4_ = iVar45;
        auVar78._8_4_ = iVar80;
        auVar78._12_4_ = iVar80;
        iVar45 = movmskpd(0,auVar78);
        if (iVar45 != 3) goto LAB_0045b00b;
        uVar8 = pQVar65[1].x1;
        uVar22 = pQVar65[1].y1;
        uVar9 = pQVar65[1].x2;
        uVar23 = pQVar65[1].y2;
        iVar45 = -(uint)(uVar9 == uVar8 + -1);
        iVar80 = -(uint)(uVar23 == uVar22 + -1);
        auVar79._4_4_ = iVar45;
        auVar79._0_4_ = iVar45;
        auVar79._8_4_ = iVar80;
        auVar79._12_4_ = iVar80;
        uVar72 = movmskpd(0,auVar79);
        uVar69 = (ulong)(uVar72 ^ 3);
        if ((uVar72 ^ 3) != 0) {
          pQVar65 = pQVar65 + 1;
          goto LAB_0045b00b;
        }
        lVar51 = lVar51 + -1;
        pQVar65 = pQVar65 + 4;
      } while (1 < lVar51);
      uVar67 = (ulong)((uint)uVar67 & 3);
      pQVar61 = (QRect *)((long)&(pQVar61->x1).m_i + (uVar60 & 0xffffffffffffffc0));
    }
    uVar62 = SUB84(pQVar65,0);
    if (uVar67 == 1) {
LAB_0045afd1:
      uVar14 = pQVar61->x1;
      uVar28 = pQVar61->y1;
      uVar15 = pQVar61->x2;
      uVar29 = pQVar61->y2;
      auVar75._0_4_ = -(uint)(uVar15 == uVar14 + -1);
      iVar45 = -(uint)(uVar29 == uVar28 + -1);
      auVar75._4_4_ = auVar75._0_4_;
      auVar75._8_4_ = iVar45;
      auVar75._12_4_ = iVar45;
      iVar45 = movmskpd(uVar62,auVar75);
      pQVar65 = pQVar61;
      if (iVar45 == 3) {
        pQVar65 = pQVar34;
      }
LAB_0045b00b:
      if (pQVar65 != pQVar34) goto LAB_0045b014;
    }
    else {
      if (uVar67 == 2) {
LAB_0045afaa:
        uVar12 = pQVar61->x1;
        uVar26 = pQVar61->y1;
        uVar13 = pQVar61->x2;
        uVar27 = pQVar61->y2;
        auVar74._0_4_ = -(uint)(uVar13 == uVar12 + -1);
        iVar45 = -(uint)(uVar27 == uVar26 + -1);
        auVar74._4_4_ = auVar74._0_4_;
        auVar74._8_4_ = iVar45;
        auVar74._12_4_ = iVar45;
        iVar45 = movmskpd(uVar62,auVar74);
        pQVar65 = pQVar61;
        if (iVar45 == 3) {
          pQVar61 = pQVar61 + 1;
          uVar62 = 0;
          goto LAB_0045afd1;
        }
        goto LAB_0045b00b;
      }
      if (uVar67 == 3) {
        uVar10 = pQVar61->x1;
        uVar24 = pQVar61->y1;
        uVar11 = pQVar61->x2;
        uVar25 = pQVar61->y2;
        auVar73._0_4_ = -(uint)(uVar11 == uVar10 + -1);
        iVar45 = -(uint)(uVar25 == uVar24 + -1);
        auVar73._4_4_ = auVar73._0_4_;
        auVar73._8_4_ = iVar45;
        auVar73._12_4_ = iVar45;
        iVar45 = movmskpd(uVar62,auVar73);
        pQVar65 = pQVar61;
        if (iVar45 == 3) {
          pQVar61 = pQVar61 + 1;
          uVar62 = 0;
          goto LAB_0045afaa;
        }
        goto LAB_0045b00b;
      }
    }
    this->eventLoop = (QEventLoop *)0x0;
    pDVar50 = (this->syncAction).wp.d;
    (this->syncAction).wp = (QWeakPointer<QObject>)0x0;
    if (pDVar50 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar50 = *(int *)pDVar50 + -1;
      UNLOCK();
      if (*(int *)pDVar50 == 0) {
        operator_delete(pDVar50);
      }
    }
    goto LAB_0045b7a6;
  }
LAB_0045b014:
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = (undefined1 *)QGuiApplicationPrivate::QLastCursorPosition::toPoint();
  qVar35 = _operator<<;
  (this->mousePopupPos).xp = QGuiApplicationPrivate::lastCursorPosition;
  (this->mousePopupPos).yp = qVar35;
  pDVar50 = (this->causedPopup).widget.wp.d;
  if (((pDVar50 == (Data *)0x0) || (*(int *)(pDVar50 + 4) == 0)) ||
     ((this->causedPopup).widget.wp.value == (QObject *)0x0)) {
    RVar47 = (*p).xp;
    RVar64 = (*p).yp;
    local_58.y1.m_i = RVar64.m_i + -3;
    local_58.x1.m_i = RVar47.m_i + -3;
    local_58.y2.m_i = RVar64.m_i + 2;
    local_58.x2.m_i = RVar47.m_i + 2;
    cVar41 = QRect::contains((QPoint *)&local_58,SUB81(&local_80,0));
  }
  else {
    cVar41 = '\0';
  }
  iVar45 = (int)uVar55;
  if (bVar40) {
    LVar46 = QWidget::layoutDirection(this_00);
    if (LVar46 == RightToLeft) {
      if (cVar41 != '\0') {
        local_70.xp.m_i = (int)local_80 - iVar45;
      }
      lVar51 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
      if ((lVar51 == 0) &&
         (lVar51 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject), lVar51 == 0)) {
        RVar47.m_i = local_70.xp.m_i;
      }
      else {
        RVar47.m_i = local_70.xp.m_i - iVar45;
        local_70.xp.m_i = RVar47.m_i;
      }
      iVar80 = RVar36.m_i + RVar43.m_i;
      if (RVar47.m_i < iVar80) {
        iVar48 = (p->xp).m_i;
        RVar47.m_i = iVar80;
        if (iVar80 < iVar48) {
          RVar47.m_i = iVar48;
        }
        local_70.xp.m_i = RVar47.m_i;
      }
      if (RVar38.m_i - RVar43.m_i < RVar47.m_i + iVar45 + -1) {
        iVar80 = (p->xp).m_i - iVar45;
        RVar47.m_i = (RVar38.m_i - (iVar45 + RVar43.m_i)) + 1;
        if (RVar47.m_i < iVar80) {
          RVar47.m_i = iVar80;
        }
        local_70.xp.m_i = RVar47.m_i;
      }
    }
    else {
      RVar47.m_i = local_70.xp.m_i;
      if (RVar38.m_i - RVar43.m_i < iVar45 + local_70.xp.m_i + -1) {
        RVar47.m_i = (RVar38.m_i - (iVar45 + RVar43.m_i)) + 1;
        local_70.xp.m_i = RVar47.m_i;
      }
      if (RVar47.m_i < RVar36.m_i + RVar43.m_i) {
        local_70.xp.m_i = RVar36.m_i + RVar43.m_i;
      }
    }
    iVar80 = (int)uVar66;
    iVar48 = RVar39.m_i - RVar43.m_i;
    RVar47.m_i = local_70.yp.m_i;
    if (iVar48 < iVar80 + local_70.yp.m_i + -1) {
      if (cVar41 == '\0') {
        iVar63 = (p->yp).m_i - (iVar80 + RVar43.m_i);
        RVar47.m_i = iVar44 - (iVar80 + RVar43.m_i);
        if (RVar47.m_i < iVar63) {
          RVar47.m_i = iVar63;
        }
      }
      else {
        iVar63 = local_80._4_4_ - (iVar80 + RVar43.m_i);
        RVar47.m_i = iVar44 - (iVar80 + RVar43.m_i);
        if (iVar63 < RVar47.m_i) {
          RVar47.m_i = iVar63;
        }
      }
      local_70.yp.m_i = RVar47.m_i;
    }
    RVar64.m_i = RVar37.m_i + RVar43.m_i;
    if (RVar47.m_i < RVar64.m_i) {
      local_70.yp.m_i = RVar64.m_i;
      RVar47.m_i = RVar64.m_i;
    }
    if (iVar48 < (int)(local_78._4_4_ + RVar47.m_i + -1)) {
      if (this->scroll == (QMenuScroller *)0x0) {
        local_70.yp.m_i = iVar44 - iVar80;
      }
      else {
        pqVar1 = &this->scroll->scrollFlags;
        *pqVar1 = *pqVar1 | 2;
        if (RVar47.m_i < RVar37.m_i) {
          RVar47.m_i = RVar37.m_i;
        }
        uVar66 = (ulong)(uint)(RVar39.m_i - (RVar47.m_i + RVar43.m_i * 2));
      }
    }
  }
  pQVar56 = QWidget::style(this_00);
  iVar44 = (**(code **)(*(long *)pQVar56 + 0xe0))(pQVar56,0x57,0,this_00);
  pQVar57 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  if ((pQVar57 != (QWidget *)0x0) &&
     ((int)((((pQVar57->data->crect).x2.m_i + iVar44) - (pQVar57->data->crect).x1.m_i) +
            (uint)local_78 + 1) < iVar70)) {
    QVar81 = actionRect(*(QMenuPrivate **)&pQVar57->field_0x8,
                        (*(QMenuPrivate **)&pQVar57->field_0x8)->currentAction);
    local_58._0_8_ = QVar81._0_8_;
    QVar58 = QWidget::mapToGlobal(pQVar57,(QPoint *)&local_58);
    RVar43 = QVar58.xp.m_i;
    iVar80 = (RVar43.m_i - QVar81.x1.m_i) + QVar81.x2.m_i.m_i;
    LVar46 = QWidget::layoutDirection(this_00);
    if (LVar46 == RightToLeft) {
      if ((RVar43.m_i - iVar44 < (int)((uint)local_78 + local_70.xp.m_i)) &&
         (local_70.xp.m_i < iVar80)) {
        local_70.xp.m_i = RVar43.m_i - (uint)local_78;
        if ((int)(RVar43.m_i - (uint)local_78) < RVar36.m_i) {
          local_70.xp.m_i = iVar80;
        }
        if ((int)uVar68 < (int)((uint)local_78 + local_70.xp.m_i)) {
          local_70.xp.m_i = RVar36.m_i;
        }
      }
    }
    else if ((local_70.xp.m_i < iVar44 + iVar80) &&
            (RVar43.m_i < (int)(local_70.xp.m_i + (uint)local_78))) {
      local_70.xp.m_i = RVar43.m_i - (uint)local_78;
      if ((int)((uint)local_78 + iVar80) <= (int)uVar68) {
        local_70.xp.m_i = iVar80;
      }
      if (local_70.xp.m_i < RVar36.m_i) {
        local_70.xp.m_i = uVar68 - (uint)local_78;
      }
    }
  }
  pQVar49 = (QObject *)QGuiApplication::screenAt(&local_70);
  if (pQVar49 == (QObject *)0x0) {
    pDVar50 = (Data *)0x0;
  }
  else {
    pDVar50 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar49);
  }
  pDVar31 = (this->popupScreen).wp.d;
  (this->popupScreen).wp.d = pDVar50;
  (this->popupScreen).wp.value = pQVar49;
  if (pDVar31 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar31 = *(int *)pDVar31 + -1;
    UNLOCK();
    if (*(int *)pDVar31 == 0) {
      operator_delete(pDVar31);
    }
  }
  local_58._0_8_ = local_70;
  local_58.y2.m_i = (int)uVar66 + local_70.yp.m_i + -1;
  local_58.x2.m_i = iVar45 + -1 + local_70.xp.m_i;
  QWidget::setGeometry(this_00,&local_58);
  LVar46 = QWidget::layoutDirection(this_00);
  uVar68 = (LVar46 != RightToLeft) + 1;
  LVar46 = QWidget::layoutDirection(this_00);
  if (LVar46 == RightToLeft) {
    if ((cVar41 == '\0') || (iVar45 / 2 + local_70.xp.m_i <= (int)local_80)) {
      lVar51 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (lVar51 != 0) {
        iVar80 = iVar45 / 2 + local_70.xp.m_i;
        iVar44 = QWidget::x((QWidget *)(this->causedPopup).widget.wp.value);
        if (iVar44 < iVar80) goto LAB_0045b567;
      }
    }
    else {
LAB_0045b567:
      uVar68 = 2;
    }
  }
  else if ((cVar41 == '\0') || ((int)local_80 <= iVar45 / 2 + local_70.xp.m_i)) {
    lVar51 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (lVar51 != 0) {
      iVar80 = iVar45 / 2 + local_70.xp.m_i;
      iVar44 = QWidget::x((QWidget *)(this->causedPopup).widget.wp.value);
      if (iVar80 < iVar44) goto LAB_0045b5b3;
    }
  }
  else {
LAB_0045b5b3:
    uVar68 = 1;
  }
  if (cVar41 == '\0') {
LAB_0045b5f3:
    lVar51 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    if (lVar51 == 0) {
      uVar72 = 8;
    }
    else {
      iVar44 = iVar45 / 2 + local_70.yp.m_i;
      pQVar57 = (QWidget *)(this->causedPopup).widget.wp.value;
      this_01 = (QWidget *)0x0;
      if (*(int *)((this->causedPopup).widget.wp.d + 4) != 0) {
        this_01 = pQVar57;
      }
      local_58._0_8_ = QWidget::pos(pQVar57);
      QVar58 = QWidget::mapToGlobal(this_01,(QPoint *)&local_58);
      uVar72 = 8;
      if (iVar44 < QVar58.yp.m_i.m_i) goto LAB_0045b655;
    }
  }
  else {
    if (local_80._4_4_ <= ((int)(uVar66 >> 0x1f) + (int)uVar66 >> 1) + local_70.yp.m_i)
    goto LAB_0045b5f3;
LAB_0045b655:
    uVar72 = 4;
  }
  bVar40 = QApplication::isEffectEnabled(UI_AnimateMenu);
  if (bVar40) {
    lVar51 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    if (lVar51 == 0) {
      lVar51 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (lVar51 != 0) {
        uVar30 = *(ushort *)(*(long *)(lVar51 + 8) + 0x420);
        uVar42 = uVar30 >> 0xc;
        *(ushort *)(*(long *)(lVar51 + 8) + 0x420) = uVar30 & 0xefff;
        goto LAB_0045b701;
      }
    }
    else {
      uVar42 = (ushort)*(byte *)(*(long *)(lVar51 + 8) + 0x2f8);
      *(undefined1 *)(*(long *)(lVar51 + 8) + 0x2f8) = 0;
LAB_0045b701:
      if ((uVar42 & 1) == 0) {
        qFadeEffect((QWidget *)0x0,-1);
        qScrollEffect((QWidget *)0x0,8,-1);
        goto LAB_0045b743;
      }
    }
    bVar40 = QApplication::isEffectEnabled(UI_FadeMenu);
    if (bVar40) {
      qFadeEffect(this_00,-1);
    }
    else {
      pDVar50 = (this->causedPopup).widget.wp.d;
      if ((pDVar50 == (Data *)0x0) ||
         ((this->causedPopup).widget.wp.value == (QObject *)0x0 || *(int *)(pDVar50 + 4) == 0)) {
        uVar68 = uVar72 | uVar68;
      }
      else {
        lVar51 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if (lVar51 == 0) {
          uVar68 = uVar72;
        }
      }
      qScrollEffect(this_00,uVar68,-1);
    }
  }
  else {
LAB_0045b743:
    QWidget::show(this_00);
  }
  local_58._0_8_ = QFont::strikeOut;
  local_58.x2.m_i = 6;
  local_58.y2.m_i = -0x55555556;
  local_40 = 0xaaaaaaaaffffffff;
  pQStack_48 = this_00;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
LAB_0045b7a6:
  pDVar50 = (this->popupScreen).wp.d;
  (this->popupScreen).wp = (QWeakPointer<QObject>)0x0;
  if (pDVar50 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar50 = *(int *)pDVar50 + -1;
    UNLOCK();
    if (*(int *)pDVar50 == 0) {
      operator_delete(pDVar50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::popup(const QPoint &p, QAction *atAction, PositionFunction positionFunction)
{
    Q_Q(QMenu);
    popupScreen = QGuiApplication::screenAt(p);
    QScopeGuard popupScreenGuard([this](){ popupScreen.clear(); });

    if (scroll) { // reset scroll state from last popup
        if (scroll->scrollOffset)
            itemsDirty = 1; // sizeHint will be incorrect if there is previous scroll
        scroll->scrollOffset = 0;
        scroll->scrollFlags = QMenuPrivate::QMenuScroller::ScrollNone;
    }
    tearoffHighlighted = 0;
    motions = 0;
    doChildEffects = true;
    updateLayoutDirection();

    q->ensurePolished(); // Get the right font

    // Ensure that we get correct sizeHints by placing this window on the correct screen.
    // However if the QMenu was constructed with a Qt::Desktop widget as its parent,
    // then initialScreenIndex was set, so we should respect that for the lifetime of this menu.
    // However if eventLoop exists, then exec() already did this by calling createWinId(); so leave it alone. (QTBUG-76162)
    if (!eventLoop) {
        bool screenSet = false;
        QScreen *screen = topData()->initialScreen;
        if (screen) {
            if (setScreen(screen))
                itemsDirty = true;
            screenSet = true;
        } else if (QMenu *parentMenu = qobject_cast<QMenu *>(parent)) {
            // a submenu is always opened from an open parent menu,
            // so show it on the same screen where the parent is. (QTBUG-76162)
            if (setScreen(parentMenu->screen()))
                itemsDirty = true;
            screenSet = true;
        }
        if (!screenSet && setScreenForPoint(p))
            itemsDirty = true;
    }

    const bool contextMenu = isContextMenu();
    if (lastContextMenu != contextMenu) {
        itemsDirty = true;
        lastContextMenu = contextMenu;
    }

    // Until QWidget::metric accepts the screen set on a widget (without having a window handle)
    // we need to make sure we get a window handle. This must be done near here because
    // we want the screen to be correctly set and items to be marked dirty.
    // (and screen set could 'fail' on oldscreen == newScreen if created before causing the
    // itemsDirty not to be set though needed to get the correct size on first show).
    if (!windowHandle()) {
        createWinId();
    }

#if QT_CONFIG(menubar)
    // if this menu is part of a chain attached to a QMenuBar, set the
    // _NET_WM_WINDOW_TYPE_DROPDOWN_MENU X11 window type
    q->setAttribute(Qt::WA_X11NetWmWindowTypeDropDownMenu, qobject_cast<QMenuBar *>(topCausedWidget()) != nullptr);
#endif

    emit q->aboutToShow();
    const bool actionListChanged = itemsDirty;

    QRect screen;
#if QT_CONFIG(graphicsview)
    bool isEmbedded = !bypassGraphicsProxyWidget(q) && QMenuPrivate::nearestGraphicsProxyWidget(q);
    if (isEmbedded)
        screen = popupGeometry();
    else
#endif
    screen = popupGeometry(QGuiApplication::screenAt(p));
    updateActionRects(screen);

    QPoint pos;
    QPushButton *causedButton = qobject_cast<QPushButton*>(causedPopup.widget);
    if (actionListChanged && causedButton)
        pos = QPushButtonPrivate::get(causedButton)->adjustedMenuPosition();
    else
        pos = p;
    popupScreen = QGuiApplication::screenAt(pos);

    const QSize menuSizeHint(q->sizeHint());
    QSize size = menuSizeHint;

    if (positionFunction)
        pos = positionFunction(menuSizeHint);

    const int desktopFrame = q->style()->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, nullptr, q);
    bool adjustToDesktop = !q->window()->testAttribute(Qt::WA_DontShowOnScreen);

    // if the screens have very different geometries and the menu is too big, we have to recalculate
    if ((size.height() > screen.height() || size.width() > screen.width()) ||
        // Layout is not right, we might be able to save horizontal space
        (ncols >1 && size.height() < screen.height())) {
        size.setWidth(qMin(menuSizeHint.width(), screen.width() - desktopFrame * 2));
        size.setHeight(qMin(menuSizeHint.height(), screen.height() - desktopFrame * 2));
        adjustToDesktop = true;
    }

#ifdef QT_KEYPAD_NAVIGATION
    if (!atAction && QApplicationPrivate::keypadNavigationEnabled()) {
        // Try to have one item activated
        if (defaultAction && defaultAction->isEnabled()) {
            atAction = defaultAction;
            // TODO: This works for first level menus, not yet sub menus
        } else {
            for (QAction *action : std::as_const(actions))
                if (action->isEnabled()) {
                    atAction = action;
                    break;
                }
        }
        currentAction = atAction;
    }
#endif
    if (ncols > 1) {
        pos.setY(screen.top() + desktopFrame);
    } else if (atAction) {
        for (int i = 0, above_height = 0; i < actions.size(); i++) {
            QAction *action = actions.at(i);
            if (action == atAction) {
                int newY = pos.y() - above_height;
                if (scroll && newY < desktopFrame) {
                    scroll->scrollFlags = scroll->scrollFlags
                                             | QMenuPrivate::QMenuScroller::ScrollUp;
                    scroll->scrollOffset = newY;
                    newY = desktopFrame;
                }
                pos.setY(newY);

                if (scroll && scroll->scrollFlags != QMenuPrivate::QMenuScroller::ScrollNone
                    && !q->style()->styleHint(QStyle::SH_Menu_FillScreenWithScroll, nullptr, q)) {
                    int below_height = above_height + scroll->scrollOffset;
                    for (int i2 = i; i2 < actionRects.size(); i2++)
                        below_height += actionRects.at(i2).height();
                    size.setHeight(below_height);
                }
                break;
            } else {
                above_height += actionRects.at(i).height();
            }
        }
    }

    // Do nothing if we don't have a valid size, e.g. when all actions are invisible
    // and there are no child widgets.
    const auto rectIsNull = [](const QRect &rect) { return rect.isNull(); };
    if (q->childrenRect().isEmpty()
     && std::all_of(actionRects.cbegin(), actionRects.cend(), rectIsNull)) {
        eventLoop = nullptr;
        syncAction = nullptr;
        return;
    }

    // Note that QGuiApplicationPrivate::lastCursorPosition isn't a QPointF,
    // so these two statements can't be simplified...
    const QPoint mouse = QGuiApplicationPrivate::lastCursorPosition.toPoint();
    mousePopupPos = QGuiApplicationPrivate::lastCursorPosition;
    const bool snapToMouse = !causedPopup.widget && (QRect(p.x() - 3, p.y() - 3, 6, 6).contains(mouse));

    if (adjustToDesktop) {
        // handle popup falling "off screen"
        if (q->isRightToLeft()) {
            if (snapToMouse) // position flowing left from the mouse
                pos.setX(mouse.x() - size.width());

#if QT_CONFIG(menubar)
            // if the menu is in a menubar or is a submenu, it should be right-aligned
            if (qobject_cast<QMenuBar*>(causedPopup.widget) || qobject_cast<QMenu*>(causedPopup.widget))
                pos.rx() -= size.width();
#endif // QT_CONFIG(menubar)

            if (pos.x() < screen.left() + desktopFrame)
                pos.setX(qMax(p.x(), screen.left() + desktopFrame));
            if (pos.x() + size.width() - 1 > screen.right() - desktopFrame)
                pos.setX(qMax(p.x() - size.width(), screen.right() - desktopFrame - size.width() + 1));
        } else {
            if (pos.x() + size.width() - 1 > screen.right() - desktopFrame)
                pos.setX(screen.right() - desktopFrame - size.width() + 1);
            if (pos.x() < screen.left() + desktopFrame)
                pos.setX(screen.left() + desktopFrame);
        }
        if (pos.y() + size.height() - 1 > screen.bottom() - desktopFrame) {
            if (snapToMouse)
                pos.setY(qMin(mouse.y() - (size.height() + desktopFrame), screen.bottom()-desktopFrame-size.height()+1));
            else
                pos.setY(qMax(p.y() - (size.height() + desktopFrame), screen.bottom()-desktopFrame-size.height()+1));
        }

        if (pos.y() < screen.top() + desktopFrame)
            pos.setY(screen.top() + desktopFrame);
        if (pos.y() + menuSizeHint.height() - 1 > screen.bottom() - desktopFrame) {
            if (scroll) {
                scroll->scrollFlags |= uint(QMenuPrivate::QMenuScroller::ScrollDown);
                int y = qMax(screen.y(),pos.y());
                size.setHeight(screen.bottom() - (desktopFrame * 2) - y);
            } else {
                // Too big for screen, bias to see bottom of menu (for some reason)
                pos.setY(screen.bottom() - size.height() + 1);
            }
        }
    }

    const int subMenuOffset = q->style()->pixelMetric(QStyle::PM_SubMenuOverlap, nullptr, q);
    QMenu *caused = qobject_cast<QMenu*>(causedPopup.widget);
    if (caused && caused->geometry().width() + menuSizeHint.width() + subMenuOffset < screen.width()) {
        QRect parentActionRect(caused->d_func()->actionRect(caused->d_func()->currentAction));
        const QPoint actionTopLeft = caused->mapToGlobal(parentActionRect.topLeft());
        parentActionRect.moveTopLeft(actionTopLeft);
        if (q->isRightToLeft()) {
            if ((pos.x() + menuSizeHint.width() > parentActionRect.left() - subMenuOffset)
                && (pos.x() < parentActionRect.right()))
            {
                pos.rx() = parentActionRect.left() - menuSizeHint.width();
                if (pos.x() < screen.x())
                    pos.rx() = parentActionRect.right();
                if (pos.x() + menuSizeHint.width() > screen.x() + screen.width())
                    pos.rx() = screen.x();
            }
        } else {
            if ((pos.x() < parentActionRect.right() + subMenuOffset)
                && (pos.x() + menuSizeHint.width() > parentActionRect.left()))
            {
                pos.rx() = parentActionRect.right();
                if (pos.x() + menuSizeHint.width() > screen.x() + screen.width())
                    pos.rx() = parentActionRect.left() - menuSizeHint.width();
                if (pos.x() < screen.x())
                    pos.rx() = screen.x() + screen.width() - menuSizeHint.width();
            }
        }
    }
    popupScreen = QGuiApplication::screenAt(pos);
    q->setGeometry(QRect(pos, size));
#if QT_CONFIG(effects)
    int hGuess = q->isRightToLeft() ? QEffects::LeftScroll : QEffects::RightScroll;
    int vGuess = QEffects::DownScroll;
    if (q->isRightToLeft()) {
        if ((snapToMouse && (pos.x() + size.width() / 2 > mouse.x())) ||
           (qobject_cast<QMenu*>(causedPopup.widget) && pos.x() + size.width() / 2 > causedPopup.widget->x()))
            hGuess = QEffects::RightScroll;
    } else {
        if ((snapToMouse && (pos.x() + size.width() / 2 < mouse.x())) ||
           (qobject_cast<QMenu*>(causedPopup.widget) && pos.x() + size.width() / 2 < causedPopup.widget->x()))
            hGuess = QEffects::LeftScroll;
    }

#if QT_CONFIG(menubar)
    if ((snapToMouse && (pos.y() + size.height() / 2 < mouse.y())) ||
       (qobject_cast<QMenuBar*>(causedPopup.widget) &&
        pos.y() + size.width() / 2 < causedPopup.widget->mapToGlobal(causedPopup.widget->pos()).y()))
       vGuess = QEffects::UpScroll;
#endif
    if (QApplication::isEffectEnabled(Qt::UI_AnimateMenu)) {
        bool doChildEffects = true;
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar*>(causedPopup.widget)) {
            doChildEffects = mb->d_func()->doChildEffects;
            mb->d_func()->doChildEffects = false;
        } else
#endif
        if (QMenu *m = qobject_cast<QMenu*>(causedPopup.widget)) {
            doChildEffects = m->d_func()->doChildEffects;
            m->d_func()->doChildEffects = false;
        }

        if (doChildEffects) {
            if (QApplication::isEffectEnabled(Qt::UI_FadeMenu))
                qFadeEffect(q);
            else if (causedPopup.widget)
                qScrollEffect(q, qobject_cast<QMenu*>(causedPopup.widget) ? hGuess : vGuess);
            else
                qScrollEffect(q, hGuess | vGuess);
        } else {
            // kill any running effect
            qFadeEffect(nullptr);
            qScrollEffect(nullptr);

            q->show();
        }
    } else
#endif
    {
        q->show();
    }

#if QT_CONFIG(accessibility)
    QAccessibleEvent event(q, QAccessible::PopupMenuStart);
    QAccessible::updateAccessibility(&event);
#endif
}